

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int a;
  int local_28;
  int b;
  int c;
  int tostore_local;
  int nelems_local;
  int base_local;
  FuncState *fs_local;
  
  a = (nelems + -1) / 0x32 + 1;
  local_28 = tostore;
  if (tostore == -1) {
    local_28 = 0;
  }
  if ((tostore != 0) && (tostore < 0x33)) {
    if (a < 0x100) {
      luaK_codeABC(fs,OP_SETLIST,base,local_28,a);
    }
    else {
      if (0xffffff < a) {
        luaX_syntaxerror(fs->ls,"constructor too long");
      }
      luaK_codeABC(fs,OP_SETLIST,base,local_28,0);
      codeextraarg(fs,a);
    }
    fs->freereg = (char)base + '\x01';
    return;
  }
  __assert_fail("tostore != 0 && tostore <= 50",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                ,0x6f5,"void luaK_setlist(FuncState *, int, int, int)");
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  int c =  (nelems - 1)/LFIELDS_PER_FLUSH + 1;
  int b = (tostore == LUA_MULTRET) ? 0 : tostore;
  lua_assert(tostore != 0 && tostore <= LFIELDS_PER_FLUSH);
  if (c <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, b, c);
  else if (c <= MAXARG_Ax) {
    luaK_codeABC(fs, OP_SETLIST, base, b, 0);
    codeextraarg(fs, c);
  }
  else
    luaX_syntaxerror(fs->ls, "constructor too long");
  fs->freereg = base + 1;  /* free registers with list values */
}